

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_table.cc
# Opt level: O0

bool __thiscall draco::CornerTable::BreakNonManifoldEdges(CornerTable *this)

{
  bool bVar1;
  reference pvVar2;
  CornerTable *in_RDI;
  reference rVar3;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  new_sink_vert;
  CornerIndex opp_other_edge_corner;
  CornerIndex opp_edge_corner;
  CornerIndex other_edge_corner;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  *attached_sink_vertex;
  iterator __end4;
  iterator __begin4;
  vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  *__range4;
  bool vertex_connectivity_updated;
  CornerIndex edge_corner;
  VertexIndex sink_v;
  CornerIndex sink_c;
  CornerIndex next_c;
  CornerIndex current_c;
  CornerIndex first_c;
  CornerIndex c;
  bool mesh_connectivity_updated;
  vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  sink_vertices;
  vector<bool,_std::allocator<bool>_> visited_corners;
  undefined1 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe09;
  undefined1 in_stack_fffffffffffffe0a;
  undefined1 in_stack_fffffffffffffe0b;
  CornerIndex in_stack_fffffffffffffe0c;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  *in_stack_fffffffffffffe10;
  CornerTable *in_stack_fffffffffffffe18;
  CornerIndex in_stack_fffffffffffffe20;
  CornerIndex in_stack_fffffffffffffe24;
  undefined2 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2a;
  undefined1 in_stack_fffffffffffffe2b;
  CornerIndex in_stack_fffffffffffffe2c;
  undefined4 in_stack_fffffffffffffe30;
  CornerIndex in_stack_fffffffffffffe34;
  byte local_17e;
  ThisIndexType local_138;
  uint local_134;
  uint local_130;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_12c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_128;
  undefined4 local_124;
  uint local_120;
  undefined4 local_11c;
  uint local_118;
  undefined4 local_114;
  uint local_110;
  undefined4 local_10c;
  uint local_108;
  uint local_104;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_100;
  uint local_fc;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_f8;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_f4;
  reference local_f0;
  pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
  *local_e8;
  __normal_iterator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_*,_std::vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>_>
  local_e0;
  undefined1 *local_d8;
  byte local_cd;
  uint local_cc;
  uint local_c8;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_c4;
  uint local_c0;
  ThisIndexType local_bc;
  reference local_b8;
  reference local_a8;
  uint local_94;
  ThisIndexType local_90;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_8c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_88;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_84;
  reference local_80;
  uint local_6c;
  IndexType<unsigned_int,_draco::CornerIndex_tag_type_> local_68;
  byte local_61;
  undefined1 local_60 [47];
  undefined1 local_31;
  
  num_corners((CornerTable *)0x1b3804);
  local_31 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x1b382b);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffffe34.value_,in_stack_fffffffffffffe30),
             CONCAT44(in_stack_fffffffffffffe2c.value_,
                      CONCAT13(in_stack_fffffffffffffe2b,
                               CONCAT12(in_stack_fffffffffffffe2a,in_stack_fffffffffffffe28))),
             (bool *)CONCAT44(in_stack_fffffffffffffe24.value_,in_stack_fffffffffffffe20.value_),
             (allocator_type *)in_stack_fffffffffffffe18);
  std::allocator<bool>::~allocator((allocator<bool> *)0x1b385f);
  std::
  vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
  ::vector((vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
            *)0x1b386c);
  do {
    local_61 = 0;
    IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_68,0);
    while( true ) {
      local_6c = num_corners((CornerTable *)0x1b389c);
      bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator<(&local_68,&local_6c);
      if (!bVar1) break;
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_68);
      rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT44(in_stack_fffffffffffffe34.value_,in_stack_fffffffffffffe30),
                         CONCAT44(in_stack_fffffffffffffe2c.value_,
                                  CONCAT13(in_stack_fffffffffffffe2b,
                                           CONCAT12(in_stack_fffffffffffffe2a,
                                                    in_stack_fffffffffffffe28))));
      local_80 = rVar3;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_80);
      if (!bVar1) {
        std::
        vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
        ::clear((vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                 *)0x1b39bf);
        local_84.value_ = local_68.value_;
        local_88.value_ = local_68.value_;
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::IndexType(&local_8c);
        while( true ) {
          local_94 = local_88.value_;
          local_90.value_ = (uint)SwingLeft(in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_8c,&local_90);
          bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                            (&local_8c,&local_84);
          local_17e = 0;
          if (bVar1) {
            bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                              (&local_8c,
                               (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                               &kInvalidCornerIndex);
            local_17e = 0;
            if (bVar1) {
              IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_8c);
              rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)
                                 CONCAT44(in_stack_fffffffffffffe34.value_,in_stack_fffffffffffffe30
                                         ),
                                 CONCAT44(in_stack_fffffffffffffe2c.value_,
                                          CONCAT13(in_stack_fffffffffffffe2b,
                                                   CONCAT12(in_stack_fffffffffffffe2a,
                                                            in_stack_fffffffffffffe28))));
              local_a8 = rVar3;
              bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_a8);
              local_17e = bVar1 ^ 0xff;
            }
          }
          if ((local_17e & 1) == 0) break;
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_88,&local_8c);
        }
        IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_84,&local_88);
        do {
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::value(&local_88);
          rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)
                             CONCAT44(in_stack_fffffffffffffe34.value_,in_stack_fffffffffffffe30),
                             CONCAT44(in_stack_fffffffffffffe2c.value_,
                                      CONCAT13(in_stack_fffffffffffffe2b,
                                               CONCAT12(in_stack_fffffffffffffe2a,
                                                        in_stack_fffffffffffffe28))));
          local_b8 = rVar3;
          std::_Bit_reference::operator=(&local_b8,true);
          local_c0 = local_88.value_;
          local_bc.value_ = (uint)Next(in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
          pvVar2 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                   ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                                 *)in_stack_fffffffffffffe10,
                                (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                CONCAT44(in_stack_fffffffffffffe0c.value_,
                                         CONCAT13(in_stack_fffffffffffffe0b,
                                                  CONCAT12(in_stack_fffffffffffffe0a,
                                                           CONCAT11(in_stack_fffffffffffffe09,
                                                                    in_stack_fffffffffffffe08)))));
          local_c4.value_ = pvVar2->value_;
          local_cc = local_88.value_;
          local_c8 = (uint)Previous(in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
          local_cd = 0;
          local_d8 = local_60;
          local_e0._M_current =
               (pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
                *)std::
                  vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                  ::begin((vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffe0c.value_,
                                      CONCAT13(in_stack_fffffffffffffe0b,
                                               CONCAT12(in_stack_fffffffffffffe0a,
                                                        CONCAT11(in_stack_fffffffffffffe09,
                                                                 in_stack_fffffffffffffe08)))));
          local_e8 = (pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
                      *)std::
                        vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                        ::end((vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe0c.value_,
                                          CONCAT13(in_stack_fffffffffffffe0b,
                                                   CONCAT12(in_stack_fffffffffffffe0a,
                                                            CONCAT11(in_stack_fffffffffffffe09,
                                                                     in_stack_fffffffffffffe08)))));
          while( true ) {
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_*,_std::vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>_>
                                *)in_stack_fffffffffffffe10,
                               (__normal_iterator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_*,_std::vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffffe0c.value_,
                                           CONCAT13(in_stack_fffffffffffffe0b,
                                                    CONCAT12(in_stack_fffffffffffffe0a,
                                                             CONCAT11(in_stack_fffffffffffffe09,
                                                                      in_stack_fffffffffffffe08)))))
            ;
            if (!bVar1) break;
            local_f0 = __gnu_cxx::
                       __normal_iterator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_*,_std::vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>_>
                       ::operator*(&local_e0);
            bVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator==
                              (&local_f0->first,&local_c4);
            if (bVar1) {
              local_f4.value_ = (local_f0->second).value_;
              local_fc = local_c8;
              in_stack_fffffffffffffe34 =
                   Opposite((CornerTable *)
                            CONCAT44(in_stack_fffffffffffffe0c.value_,
                                     CONCAT13(in_stack_fffffffffffffe0b,
                                              CONCAT12(in_stack_fffffffffffffe0a,
                                                       CONCAT11(in_stack_fffffffffffffe09,
                                                                in_stack_fffffffffffffe08)))),
                            (uint)in_stack_fffffffffffffe10);
              local_f8.value_ = in_stack_fffffffffffffe34.value_;
              bVar1 = IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator==
                                (&local_f8,&local_f4);
              in_stack_fffffffffffffe30 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe30);
              if (!bVar1) {
                local_104 = local_f4.value_;
                in_stack_fffffffffffffe2c =
                     Opposite((CornerTable *)
                              CONCAT44(in_stack_fffffffffffffe0c.value_,
                                       CONCAT13(in_stack_fffffffffffffe0b,
                                                CONCAT12(in_stack_fffffffffffffe0a,
                                                         CONCAT11(in_stack_fffffffffffffe09,
                                                                  in_stack_fffffffffffffe08)))),
                              (uint)in_stack_fffffffffffffe10);
                local_100.value_ = in_stack_fffffffffffffe2c.value_;
                in_stack_fffffffffffffe2b =
                     IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                               (&local_f8,
                                (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                &kInvalidCornerIndex);
                if ((bool)in_stack_fffffffffffffe2b) {
                  local_108 = local_f8.value_;
                  local_10c = 0xffffffff;
                  SetOppositeCorner((CornerTable *)
                                    CONCAT44(in_stack_fffffffffffffe0c.value_,
                                             CONCAT13(in_stack_fffffffffffffe0b,
                                                      CONCAT12(in_stack_fffffffffffffe0a,
                                                               CONCAT11(in_stack_fffffffffffffe09,
                                                                        in_stack_fffffffffffffe08)))
                                            ),
                                    (CornerIndex)(uint)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                                    (CornerIndex)(uint)in_stack_fffffffffffffe10);
                }
                in_stack_fffffffffffffe2a =
                     IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                               (&local_100,
                                (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                                &kInvalidCornerIndex);
                if ((bool)in_stack_fffffffffffffe2a) {
                  local_110 = local_100.value_;
                  local_114 = 0xffffffff;
                  SetOppositeCorner((CornerTable *)
                                    CONCAT44(in_stack_fffffffffffffe0c.value_,
                                             CONCAT13(in_stack_fffffffffffffe0b,
                                                      CONCAT12(in_stack_fffffffffffffe0a,
                                                               CONCAT11(in_stack_fffffffffffffe09,
                                                                        in_stack_fffffffffffffe08)))
                                            ),
                                    (CornerIndex)(uint)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                                    (CornerIndex)(uint)in_stack_fffffffffffffe10);
                }
                local_118 = local_c8;
                local_11c = 0xffffffff;
                SetOppositeCorner((CornerTable *)
                                  CONCAT44(in_stack_fffffffffffffe0c.value_,
                                           CONCAT13(in_stack_fffffffffffffe0b,
                                                    CONCAT12(in_stack_fffffffffffffe0a,
                                                             CONCAT11(in_stack_fffffffffffffe09,
                                                                      in_stack_fffffffffffffe08)))),
                                  (CornerIndex)(uint)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                                  (CornerIndex)(uint)in_stack_fffffffffffffe10);
                local_120 = local_f4.value_;
                local_124 = 0xffffffff;
                SetOppositeCorner((CornerTable *)
                                  CONCAT44(in_stack_fffffffffffffe0c.value_,
                                           CONCAT13(in_stack_fffffffffffffe0b,
                                                    CONCAT12(in_stack_fffffffffffffe0a,
                                                             CONCAT11(in_stack_fffffffffffffe09,
                                                                      in_stack_fffffffffffffe08)))),
                                  (CornerIndex)(uint)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                                  (CornerIndex)(uint)in_stack_fffffffffffffe10);
                local_cd = 1;
                break;
              }
            }
            __gnu_cxx::
            __normal_iterator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_*,_std::vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>_>
            ::operator++(&local_e0);
          }
          if ((local_cd & 1) != 0) {
            local_61 = 1;
            break;
          }
          std::
          pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
          ::
          pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_true>
                    (in_stack_fffffffffffffe10);
          local_134 = local_88.value_;
          in_stack_fffffffffffffe18 = in_RDI;
          in_stack_fffffffffffffe24 = Previous(in_RDI,in_stack_fffffffffffffe20);
          local_130 = in_stack_fffffffffffffe24.value_;
          in_stack_fffffffffffffe10 =
               (pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>
                *)IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                  ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>
                                *)in_stack_fffffffffffffe10,
                               (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                               CONCAT44(in_stack_fffffffffffffe0c.value_,
                                        CONCAT13(in_stack_fffffffffffffe0b,
                                                 CONCAT12(in_stack_fffffffffffffe0a,
                                                          CONCAT11(in_stack_fffffffffffffe09,
                                                                   in_stack_fffffffffffffe08)))));
          IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::operator=
                    (&local_12c,(ThisIndexType *)in_stack_fffffffffffffe10);
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_128,&local_bc);
          std::
          vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
          ::push_back((vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe24.value_,in_stack_fffffffffffffe20.value_)
                      ,(value_type *)in_stack_fffffffffffffe18);
          in_stack_fffffffffffffe0c =
               SwingRight(in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
          local_138.value_ = in_stack_fffffffffffffe0c.value_;
          IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator=(&local_88,&local_138);
          in_stack_fffffffffffffe0b =
               IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                         (&local_88,&local_84);
          in_stack_fffffffffffffe0a = false;
          if ((bool)in_stack_fffffffffffffe0b) {
            in_stack_fffffffffffffe09 =
                 IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator!=
                           (&local_88,
                            (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)
                            &kInvalidCornerIndex);
            in_stack_fffffffffffffe0a = in_stack_fffffffffffffe09;
          }
        } while ((bool)in_stack_fffffffffffffe0a != false);
      }
      IndexType<unsigned_int,_draco::CornerIndex_tag_type_>::operator++(&local_68);
    }
    if ((local_61 & 1) == 0) {
      std::
      vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
      ::~vector((vector<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>,_std::allocator<std::pair<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe24.value_,in_stack_fffffffffffffe20.value_));
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x1b4045);
      return true;
    }
  } while( true );
}

Assistant:

bool CornerTable::BreakNonManifoldEdges() {
  // This function detects and breaks non-manifold edges that are caused by
  // folds in 1-ring neighborhood around a vertex. Non-manifold edges can occur
  // when the 1-ring surface around a vertex self-intersects in a common edge.
  // For example imagine a surface around a pivot vertex 0, where the 1-ring
  // is defined by vertices |1, 2, 3, 1, 4|. The surface passes edge <0, 1>
  // twice which would result in a non-manifold edge that needs to be broken.
  // For now all faces connected to these non-manifold edges are disconnected
  // resulting in open boundaries on the mesh. New vertices will be created
  // automatically for each new disjoint patch in the ComputeVertexCorners()
  // method.
  // Note that all other non-manifold edges are implicitly handled by the
  // function ComputeVertexCorners() that automatically creates new vertices
  // on disjoint 1-ring surface patches.

  std::vector<bool> visited_corners(num_corners(), false);
  std::vector<std::pair<VertexIndex, CornerIndex>> sink_vertices;
  bool mesh_connectivity_updated = false;
  do {
    mesh_connectivity_updated = false;
    for (CornerIndex c(0); c < num_corners(); ++c) {
      if (visited_corners[c.value()]) {
        continue;
      }
      sink_vertices.clear();

      // First swing all the way to find the left-most corner connected to the
      // corner's vertex.
      CornerIndex first_c = c;
      CornerIndex current_c = c;
      CornerIndex next_c;
      while (next_c = SwingLeft(current_c),
             next_c != first_c && next_c != kInvalidCornerIndex &&
                 !visited_corners[next_c.value()]) {
        current_c = next_c;
      }

      first_c = current_c;

      // Swing right from the first corner and check if all visited edges
      // are unique.
      do {
        visited_corners[current_c.value()] = true;
        // Each new edge is defined by the pivot vertex (that is the same for
        // all faces) and by the sink vertex (that is the |next| vertex from the
        // currently processed pivot corner. I.e., each edge is uniquely defined
        // by the sink vertex index.
        const CornerIndex sink_c = Next(current_c);
        const VertexIndex sink_v = corner_to_vertex_map_[sink_c];

        // Corner that defines the edge on the face.
        const CornerIndex edge_corner = Previous(current_c);
        bool vertex_connectivity_updated = false;
        // Go over all processed edges (sink vertices). If the current sink
        // vertex has been already encountered before it may indicate a
        // non-manifold edge that needs to be broken.
        for (auto &&attached_sink_vertex : sink_vertices) {
          if (attached_sink_vertex.first == sink_v) {
            // Sink vertex has been already processed.
            const CornerIndex other_edge_corner = attached_sink_vertex.second;
            const CornerIndex opp_edge_corner = Opposite(edge_corner);

            if (opp_edge_corner == other_edge_corner) {
              // We are closing the loop so no need to change the connectivity.
              continue;
            }

            // Break the connectivity on the non-manifold edge.
            // TODO(ostava): It may be possible to reconnect the faces in a way
            // that the final surface would be manifold.
            const CornerIndex opp_other_edge_corner =
                Opposite(other_edge_corner);
            if (opp_edge_corner != kInvalidCornerIndex) {
              SetOppositeCorner(opp_edge_corner, kInvalidCornerIndex);
            }
            if (opp_other_edge_corner != kInvalidCornerIndex) {
              SetOppositeCorner(opp_other_edge_corner, kInvalidCornerIndex);
            }

            SetOppositeCorner(edge_corner, kInvalidCornerIndex);
            SetOppositeCorner(other_edge_corner, kInvalidCornerIndex);

            vertex_connectivity_updated = true;
            break;
          }
        }
        if (vertex_connectivity_updated) {
          // Because of the updated connectivity, not all corners connected to
          // this vertex have been processed and we need to go over them again.
          // TODO(ostava): This can be optimized as we don't really need to
          // iterate over all corners.
          mesh_connectivity_updated = true;
          break;
        }
        // Insert new sink vertex information <sink vertex index, edge corner>.
        std::pair<VertexIndex, CornerIndex> new_sink_vert;
        new_sink_vert.first = corner_to_vertex_map_[Previous(current_c)];
        new_sink_vert.second = sink_c;
        sink_vertices.push_back(new_sink_vert);

        current_c = SwingRight(current_c);
      } while (current_c != first_c && current_c != kInvalidCornerIndex);
    }
  } while (mesh_connectivity_updated);
  return true;
}